

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_string_field.cc
# Opt level: O0

void google::protobuf::compiler::java::anon_unknown_5::SetPrimitiveVariables
               (FieldDescriptor *descriptor,int messageBitIndex,int builderBitIndex,
               FieldGeneratorInfo *info,ClassNameResolver *name_resolver,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *variables)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmVar1;
  bool bVar2;
  uint32 uVar3;
  int field_number;
  Type TVar4;
  char *pcVar5;
  mapped_type *pmVar6;
  mapped_type *this;
  protobuf *this_00;
  FieldOptions *this_01;
  FileDescriptor *descriptor_00;
  int i;
  int i_00;
  int bitIndex;
  int bitIndex_00;
  int bitIndex_01;
  int bitIndex_02;
  int bitIndex_03;
  int bitIndex_04;
  unsigned_long i_01;
  allocator local_e09;
  key_type local_e08;
  string local_de8;
  allocator local_dc1;
  key_type local_dc0;
  string local_da0;
  allocator local_d79;
  key_type local_d78;
  allocator local_d51;
  key_type local_d50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d30;
  allocator local_d09;
  key_type local_d08;
  allocator local_ce1;
  key_type local_ce0;
  allocator local_cb9;
  key_type local_cb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c78;
  allocator local_c51;
  key_type local_c50;
  allocator local_c29;
  key_type local_c28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_be8;
  allocator local_bc1;
  key_type local_bc0;
  allocator local_b99;
  key_type local_b98;
  allocator local_b71;
  key_type local_b70;
  allocator local_b49;
  key_type local_b48;
  string local_b28;
  allocator local_b01;
  key_type local_b00;
  string local_ae0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ac0;
  allocator local_a99;
  key_type local_a98;
  string local_a78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a58;
  allocator local_a31;
  key_type local_a30;
  string local_a10;
  allocator local_9e9;
  key_type local_9e8;
  string local_9c8;
  uint local_9a8;
  allocator local_9a1;
  int fixed_size;
  allocator local_979;
  key_type local_978;
  allocator local_951;
  key_type local_950;
  allocator local_929;
  key_type local_928;
  allocator local_901;
  key_type local_900;
  string local_8e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8c0;
  allocator local_899;
  key_type local_898;
  allocator local_871;
  key_type local_870;
  allocator local_849;
  key_type local_848;
  allocator local_821;
  key_type local_820;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_800;
  allocator local_7d9;
  key_type local_7d8;
  allocator local_7b1;
  key_type local_7b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_790;
  allocator local_769;
  key_type local_768;
  allocator local_741;
  key_type local_740;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_720;
  allocator local_6f9;
  key_type local_6f8;
  allocator local_6d1;
  key_type local_6d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b0;
  allocator local_689;
  key_type local_688;
  allocator local_661;
  key_type local_660;
  allocator local_639;
  key_type local_638;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_618;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f8;
  allocator local_5d1;
  key_type local_5d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_590;
  allocator local_569;
  key_type local_568;
  allocator local_541;
  key_type local_540;
  allocator local_519;
  key_type local_518;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8;
  allocator local_4b1;
  key_type local_4b0;
  allocator local_489;
  key_type local_488;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  allocator local_421;
  key_type local_420;
  allocator local_3f9;
  key_type local_3f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  allocator local_391;
  key_type local_390;
  allocator local_369;
  key_type local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  allocator local_321;
  key_type local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  allocator local_2b9;
  key_type local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  allocator local_251;
  string local_250;
  undefined1 local_230 [8];
  string capitalized_type;
  key_type local_208;
  allocator local_1e1;
  key_type local_1e0;
  string local_1c0;
  allocator local_199;
  key_type local_198;
  string local_178;
  allocator local_151;
  key_type local_150;
  allocator local_129;
  key_type local_128;
  string local_108;
  allocator local_e1;
  key_type local_e0;
  allocator local_b9;
  key_type local_b8;
  allocator local_91;
  key_type local_90;
  allocator local_59;
  key_type local_58;
  JavaType local_34;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmStack_30;
  JavaType javaType;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables_local;
  ClassNameResolver *name_resolver_local;
  FieldGeneratorInfo *info_local;
  int builderBitIndex_local;
  int messageBitIndex_local;
  FieldDescriptor *descriptor_local;
  
  pmStack_30 = variables;
  variables_local =
       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *)name_resolver;
  name_resolver_local = (ClassNameResolver *)info;
  info_local._0_4_ = builderBitIndex;
  info_local._4_4_ = messageBitIndex;
  _builderBitIndex_local = descriptor;
  SetCommonFieldVariables(descriptor,info,variables);
  local_34 = GetJavaType(_builderBitIndex_local);
  pcVar5 = PrimitiveTypeName(local_34);
  pmVar1 = pmStack_30;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_58,"type",&local_59);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_58);
  std::__cxx11::string::operator=((string *)pmVar6,pcVar5);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  pcVar5 = BoxedPrimitiveTypeName(local_34);
  pmVar1 = pmStack_30;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_90,"boxed_type",&local_91);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_90);
  std::__cxx11::string::operator=((string *)pmVar6,pcVar5);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  pmVar1 = pmStack_30;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b8,"type",&local_b9);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_b8);
  pmVar1 = pmStack_30;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e0,"field_type",&local_e1);
  this = std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator[](pmVar1,&local_e0);
  std::__cxx11::string::operator=((string *)this,(string *)pmVar6);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  ImmutableDefaultValue_abi_cxx11_
            (&local_108,(java *)_builderBitIndex_local,(FieldDescriptor *)variables_local,
             (ClassNameResolver *)info);
  pmVar1 = pmStack_30;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_128,"default",&local_129);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_128);
  std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_108);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  std::__cxx11::string::~string((string *)&local_108);
  pcVar5 = GetCapitalizedType(_builderBitIndex_local,true);
  pmVar1 = pmStack_30;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_150,"capitalized_type",&local_151);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_150);
  std::__cxx11::string::operator=((string *)pmVar6,pcVar5);
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator((allocator<char> *)&local_151);
  uVar3 = internal::WireFormat::MakeTag(_builderBitIndex_local);
  SimpleItoa_abi_cxx11_(&local_178,(protobuf *)(ulong)uVar3,i);
  pmVar1 = pmStack_30;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_198,"tag",&local_199);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_198);
  std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_178);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator((allocator<char> *)&local_199);
  std::__cxx11::string::~string((string *)&local_178);
  field_number = FieldDescriptor::number(_builderBitIndex_local);
  TVar4 = GetType(_builderBitIndex_local);
  this_00 = (protobuf *)internal::WireFormat::TagSize(field_number,TVar4);
  SimpleItoa_abi_cxx11_(&local_1c0,this_00,i_01);
  pmVar1 = pmStack_30;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1e0,"tag_size",&local_1e1);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_1e0);
  std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
  std::__cxx11::string::~string((string *)&local_1c0);
  bVar2 = FieldDescriptor::is_required(_builderBitIndex_local);
  pmVar1 = pmStack_30;
  pcVar5 = "false";
  if (bVar2) {
    pcVar5 = "true";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_208,"required",
             (allocator *)(capitalized_type.field_2._M_local_buf + 0xf));
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_208);
  std::__cxx11::string::operator=((string *)pmVar6,pcVar5);
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::~allocator((allocator<char> *)(capitalized_type.field_2._M_local_buf + 0xf))
  ;
  pcVar5 = PrimitiveTypeName(local_34);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_250,pcVar5,&local_251);
  UnderscoresToCamelCase((string *)local_230,&local_250,true);
  std::__cxx11::string::~string((string *)&local_250);
  std::allocator<char>::~allocator((allocator<char> *)&local_251);
  pmVar1 = pmStack_30;
  if (local_34 < JAVATYPE_STRING) {
    std::operator+(&local_298,"com.google.protobuf.Internal.",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_230);
    std::operator+(&local_278,&local_298,"List");
    pmVar1 = pmStack_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2b8,"field_list_type",&local_2b9);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_2b8);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_278);
    std::__cxx11::string::~string((string *)&local_2b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
    std::__cxx11::string::~string((string *)&local_278);
    std::__cxx11::string::~string((string *)&local_298);
    std::operator+(&local_300,"empty",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_230);
    std::operator+(&local_2e0,&local_300,"List()");
    pmVar1 = pmStack_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_320,"empty_list",&local_321);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_320);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_2e0);
    std::__cxx11::string::~string((string *)&local_320);
    std::allocator<char>::~allocator((allocator<char> *)&local_321);
    std::__cxx11::string::~string((string *)&local_2e0);
    std::__cxx11::string::~string((string *)&local_300);
    pmVar1 = pmStack_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_368,"name",&local_369);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_368);
    std::operator+(&local_348,pmVar6,"_.makeImmutable()");
    pmVar1 = pmStack_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_390,"make_name_unmodifiable",&local_391);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_390);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_348);
    std::__cxx11::string::~string((string *)&local_390);
    std::allocator<char>::~allocator((allocator<char> *)&local_391);
    std::__cxx11::string::~string((string *)&local_348);
    std::__cxx11::string::~string((string *)&local_368);
    std::allocator<char>::~allocator((allocator<char> *)&local_369);
    pmVar1 = pmStack_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3f8,"name",&local_3f9);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_3f8);
    std::operator+(&local_3d8,pmVar6,"_.get");
    std::operator+(&local_3b8,&local_3d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_230);
    pmVar1 = pmStack_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_420,"repeated_get",&local_421);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_420);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_3b8);
    std::__cxx11::string::~string((string *)&local_420);
    std::allocator<char>::~allocator((allocator<char> *)&local_421);
    std::__cxx11::string::~string((string *)&local_3b8);
    std::__cxx11::string::~string((string *)&local_3d8);
    std::__cxx11::string::~string((string *)&local_3f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_3f9);
    pmVar1 = pmStack_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_488,"name",&local_489);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_488);
    std::operator+(&local_468,pmVar6,"_.add");
    std::operator+(&local_448,&local_468,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_230);
    pmVar1 = pmStack_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_4b0,"repeated_add",&local_4b1);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_4b0);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_448);
    std::__cxx11::string::~string((string *)&local_4b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_4b1);
    std::__cxx11::string::~string((string *)&local_448);
    std::__cxx11::string::~string((string *)&local_468);
    std::__cxx11::string::~string((string *)&local_488);
    std::allocator<char>::~allocator((allocator<char> *)&local_489);
    pmVar1 = pmStack_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_518,"name",&local_519);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_518);
    std::operator+(&local_4f8,pmVar6,"_.set");
    std::operator+(&local_4d8,&local_4f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_230);
    pmVar1 = pmStack_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_540,"repeated_set",&local_541);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_540);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_4d8);
    std::__cxx11::string::~string((string *)&local_540);
    std::allocator<char>::~allocator((allocator<char> *)&local_541);
    std::__cxx11::string::~string((string *)&local_4d8);
    std::__cxx11::string::~string((string *)&local_4f8);
    std::__cxx11::string::~string((string *)&local_518);
    std::allocator<char>::~allocator((allocator<char> *)&local_519);
    pmVar1 = pmStack_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_568,"visit_type",&local_569);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_568);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)local_230);
    std::__cxx11::string::~string((string *)&local_568);
    std::allocator<char>::~allocator((allocator<char> *)&local_569);
    std::operator+(&local_5b0,"visit",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_230);
    std::operator+(&local_590,&local_5b0,"List");
    pmVar1 = pmStack_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_5d0,"visit_type_list",&local_5d1);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_5d0);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_590);
    std::__cxx11::string::~string((string *)&local_5d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_5d1);
    std::__cxx11::string::~string((string *)&local_590);
    std::__cxx11::string::~string((string *)&local_5b0);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_638,"boxed_type",&local_639);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_638);
    std::operator+(&local_618,"com.google.protobuf.Internal.ProtobufList<",pmVar6);
    std::operator+(&local_5f8,&local_618,">");
    pmVar1 = pmStack_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_660,"field_list_type",&local_661);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_660);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_5f8);
    std::__cxx11::string::~string((string *)&local_660);
    std::allocator<char>::~allocator((allocator<char> *)&local_661);
    std::__cxx11::string::~string((string *)&local_5f8);
    std::__cxx11::string::~string((string *)&local_618);
    std::__cxx11::string::~string((string *)&local_638);
    std::allocator<char>::~allocator((allocator<char> *)&local_639);
    pmVar1 = pmStack_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_688,"empty_list",&local_689);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_688);
    std::__cxx11::string::operator=((string *)pmVar6,"emptyProtobufList()");
    std::__cxx11::string::~string((string *)&local_688);
    std::allocator<char>::~allocator((allocator<char> *)&local_689);
    pmVar1 = pmStack_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_6d0,"name",&local_6d1);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_6d0);
    std::operator+(&local_6b0,pmVar6,"_.makeImmutable()");
    pmVar1 = pmStack_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_6f8,"make_name_unmodifiable",&local_6f9);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_6f8);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_6b0);
    std::__cxx11::string::~string((string *)&local_6f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_6f9);
    std::__cxx11::string::~string((string *)&local_6b0);
    std::__cxx11::string::~string((string *)&local_6d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_6d1);
    pmVar1 = pmStack_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_740,"name",&local_741);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_740);
    std::operator+(&local_720,pmVar6,"_.get");
    pmVar1 = pmStack_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_768,"repeated_get",&local_769);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_768);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_720);
    std::__cxx11::string::~string((string *)&local_768);
    std::allocator<char>::~allocator((allocator<char> *)&local_769);
    std::__cxx11::string::~string((string *)&local_720);
    std::__cxx11::string::~string((string *)&local_740);
    std::allocator<char>::~allocator((allocator<char> *)&local_741);
    pmVar1 = pmStack_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_7b0,"name",&local_7b1);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_7b0);
    std::operator+(&local_790,pmVar6,"_.add");
    pmVar1 = pmStack_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_7d8,"repeated_add",&local_7d9);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_7d8);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_790);
    std::__cxx11::string::~string((string *)&local_7d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_7d9);
    std::__cxx11::string::~string((string *)&local_790);
    std::__cxx11::string::~string((string *)&local_7b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_7b1);
    pmVar1 = pmStack_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_820,"name",&local_821);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_820);
    std::operator+(&local_800,pmVar6,"_.set");
    pmVar1 = pmStack_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_848,"repeated_set",&local_849);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_848);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_800);
    std::__cxx11::string::~string((string *)&local_848);
    std::allocator<char>::~allocator((allocator<char> *)&local_849);
    std::__cxx11::string::~string((string *)&local_800);
    std::__cxx11::string::~string((string *)&local_820);
    std::allocator<char>::~allocator((allocator<char> *)&local_821);
    pmVar1 = pmStack_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_870,"visit_type",&local_871);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_870);
    std::__cxx11::string::operator=((string *)pmVar6,"ByteString");
    std::__cxx11::string::~string((string *)&local_870);
    std::allocator<char>::~allocator((allocator<char> *)&local_871);
    pmVar1 = pmStack_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_898,"visit_type_list",&local_899);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_898);
    std::__cxx11::string::operator=((string *)pmVar6,"visitList");
    std::__cxx11::string::~string((string *)&local_898);
    std::allocator<char>::~allocator((allocator<char> *)&local_899);
  }
  pmVar1 = pmStack_30;
  if (local_34 == JAVATYPE_BYTES) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_900,"name",&local_901);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_900);
    ToUpper(&local_8e0,pmVar6);
    std::operator+(&local_8c0,&local_8e0,"_DEFAULT_VALUE");
    pmVar1 = pmStack_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_928,"bytes_default",&local_929);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_928);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_8c0);
    std::__cxx11::string::~string((string *)&local_928);
    std::allocator<char>::~allocator((allocator<char> *)&local_929);
    std::__cxx11::string::~string((string *)&local_8c0);
    std::__cxx11::string::~string((string *)&local_8e0);
    std::__cxx11::string::~string((string *)&local_900);
    std::allocator<char>::~allocator((allocator<char> *)&local_901);
  }
  bVar2 = IsReferenceType(local_34);
  pmVar1 = pmStack_30;
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_950,"null_check",&local_951);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_950);
    std::__cxx11::string::operator=
              ((string *)pmVar6,
               "  if (value == null) {\n    throw new NullPointerException();\n  }\n");
    std::__cxx11::string::~string((string *)&local_950);
    std::allocator<char>::~allocator((allocator<char> *)&local_951);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_978,"null_check",&local_979);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_978);
    std::__cxx11::string::operator=((string *)pmVar6,"");
    std::__cxx11::string::~string((string *)&local_978);
    std::allocator<char>::~allocator((allocator<char> *)&local_979);
  }
  this_01 = FieldDescriptor::options(_builderBitIndex_local);
  bVar2 = FieldOptions::deprecated(this_01);
  pmVar1 = pmStack_30;
  pcVar5 = "";
  if (bVar2) {
    pcVar5 = "@java.lang.Deprecated ";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&fixed_size,"deprecation",&local_9a1);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,(key_type *)&fixed_size);
  std::__cxx11::string::operator=((string *)pmVar6,pcVar5);
  std::__cxx11::string::~string((string *)&fixed_size);
  std::allocator<char>::~allocator((allocator<char> *)&local_9a1);
  TVar4 = GetType(_builderBitIndex_local);
  local_9a8 = FixedSize(TVar4);
  if (local_9a8 != 0xffffffff) {
    SimpleItoa_abi_cxx11_(&local_9c8,(protobuf *)(ulong)local_9a8,i_00);
    pmVar1 = pmStack_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_9e8,"fixed_size",&local_9e9);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_9e8);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_9c8);
    std::__cxx11::string::~string((string *)&local_9e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_9e9);
    std::__cxx11::string::~string((string *)&local_9c8);
  }
  descriptor_00 = FieldDescriptor::file(_builderBitIndex_local);
  bVar2 = SupportFieldPresence(descriptor_00);
  pmVar1 = pmStack_30;
  if (bVar2) {
    GenerateGetBit_abi_cxx11_(&local_a10,(java *)(ulong)info_local._4_4_,bitIndex);
    pmVar1 = pmStack_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_a30,"get_has_field_bit_message",&local_a31);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_a30);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_a10);
    std::__cxx11::string::~string((string *)&local_a30);
    std::allocator<char>::~allocator((allocator<char> *)&local_a31);
    std::__cxx11::string::~string((string *)&local_a10);
    GenerateSetBit_abi_cxx11_(&local_a78,(java *)(ulong)info_local._4_4_,bitIndex_00);
    std::operator+(&local_a58,&local_a78,";");
    pmVar1 = pmStack_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_a98,"set_has_field_bit_message",&local_a99);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_a98);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_a58);
    std::__cxx11::string::~string((string *)&local_a98);
    std::allocator<char>::~allocator((allocator<char> *)&local_a99);
    std::__cxx11::string::~string((string *)&local_a58);
    std::__cxx11::string::~string((string *)&local_a78);
    GenerateClearBit_abi_cxx11_(&local_ae0,(java *)(ulong)info_local._4_4_,bitIndex_01);
    std::operator+(&local_ac0,&local_ae0,";");
    pmVar1 = pmStack_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_b00,"clear_has_field_bit_message",&local_b01);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_b00);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_ac0);
    std::__cxx11::string::~string((string *)&local_b00);
    std::allocator<char>::~allocator((allocator<char> *)&local_b01);
    std::__cxx11::string::~string((string *)&local_ac0);
    std::__cxx11::string::~string((string *)&local_ae0);
    GenerateGetBit_abi_cxx11_(&local_b28,(java *)(ulong)info_local._4_4_,bitIndex_02);
    pmVar1 = pmStack_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_b48,"is_field_present_message",&local_b49);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_b48);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_b28);
    std::__cxx11::string::~string((string *)&local_b48);
    std::allocator<char>::~allocator((allocator<char> *)&local_b49);
    std::__cxx11::string::~string((string *)&local_b28);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_b70,"set_has_field_bit_message",&local_b71);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_b70);
    std::__cxx11::string::operator=((string *)pmVar6,"");
    std::__cxx11::string::~string((string *)&local_b70);
    std::allocator<char>::~allocator((allocator<char> *)&local_b71);
    pmVar1 = pmStack_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_b98,"set_has_field_bit_message",&local_b99);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_b98);
    std::__cxx11::string::operator=((string *)pmVar6,"");
    std::__cxx11::string::~string((string *)&local_b98);
    std::allocator<char>::~allocator((allocator<char> *)&local_b99);
    pmVar1 = pmStack_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_bc0,"clear_has_field_bit_message",&local_bc1);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_bc0);
    std::__cxx11::string::operator=((string *)pmVar6,"");
    std::__cxx11::string::~string((string *)&local_bc0);
    std::allocator<char>::~allocator((allocator<char> *)&local_bc1);
    TVar4 = FieldDescriptor::type(_builderBitIndex_local);
    pmVar1 = pmStack_30;
    if (TVar4 == TYPE_BYTES) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_c28,"name",&local_c29);
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](pmVar1,&local_c28);
      std::operator+(&local_c08,"!",pmVar6);
      std::operator+(&local_be8,&local_c08,"_.isEmpty()");
      pmVar1 = pmStack_30;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_c50,"is_field_present_message",&local_c51);
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](pmVar1,&local_c50);
      std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_be8);
      std::__cxx11::string::~string((string *)&local_c50);
      std::allocator<char>::~allocator((allocator<char> *)&local_c51);
      std::__cxx11::string::~string((string *)&local_be8);
      std::__cxx11::string::~string((string *)&local_c08);
      std::__cxx11::string::~string((string *)&local_c28);
      std::allocator<char>::~allocator((allocator<char> *)&local_c29);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_cb8,"name",&local_cb9);
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](pmVar1,&local_cb8);
      std::operator+(&local_c98,pmVar6,"_ != ");
      pmVar1 = pmStack_30;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_ce0,"default",&local_ce1);
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](pmVar1,&local_ce0);
      std::operator+(&local_c78,&local_c98,pmVar6);
      pmVar1 = pmStack_30;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_d08,"is_field_present_message",&local_d09);
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](pmVar1,&local_d08);
      std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_c78);
      std::__cxx11::string::~string((string *)&local_d08);
      std::allocator<char>::~allocator((allocator<char> *)&local_d09);
      std::__cxx11::string::~string((string *)&local_c78);
      std::__cxx11::string::~string((string *)&local_ce0);
      std::allocator<char>::~allocator((allocator<char> *)&local_ce1);
      std::__cxx11::string::~string((string *)&local_c98);
      std::__cxx11::string::~string((string *)&local_cb8);
      std::allocator<char>::~allocator((allocator<char> *)&local_cb9);
    }
  }
  pmVar1 = pmStack_30;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d50,"name",&local_d51);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_d50);
  std::operator+(&local_d30,pmVar6,"_.isModifiable()");
  pmVar1 = pmStack_30;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d78,"is_mutable",&local_d79);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_d78);
  std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_d30);
  std::__cxx11::string::~string((string *)&local_d78);
  std::allocator<char>::~allocator((allocator<char> *)&local_d79);
  std::__cxx11::string::~string((string *)&local_d30);
  std::__cxx11::string::~string((string *)&local_d50);
  std::allocator<char>::~allocator((allocator<char> *)&local_d51);
  GenerateGetBitFromLocal_abi_cxx11_(&local_da0,(java *)(ulong)(uint)info_local,bitIndex_03);
  pmVar1 = pmStack_30;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_dc0,"get_has_field_bit_from_local",&local_dc1);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_dc0);
  std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_da0);
  std::__cxx11::string::~string((string *)&local_dc0);
  std::allocator<char>::~allocator((allocator<char> *)&local_dc1);
  std::__cxx11::string::~string((string *)&local_da0);
  GenerateSetBitToLocal_abi_cxx11_(&local_de8,(java *)(ulong)info_local._4_4_,bitIndex_04);
  pmVar1 = pmStack_30;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e08,"set_has_field_bit_to_local",&local_e09);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_e08);
  std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_de8);
  std::__cxx11::string::~string((string *)&local_e08);
  std::allocator<char>::~allocator((allocator<char> *)&local_e09);
  std::__cxx11::string::~string((string *)&local_de8);
  std::__cxx11::string::~string((string *)local_230);
  return;
}

Assistant:

void SetPrimitiveVariables(const FieldDescriptor* descriptor,
                           int messageBitIndex,
                           int builderBitIndex,
                           const FieldGeneratorInfo* info,
                           ClassNameResolver* name_resolver,
                           std::map<string, string>* variables) {
  SetCommonFieldVariables(descriptor, info, variables);

  (*variables)["empty_list"] = "com.google.protobuf.LazyStringArrayList.EMPTY";

  (*variables)["default"] = ImmutableDefaultValue(descriptor, name_resolver);
  (*variables)["default_init"] =
      "= " + ImmutableDefaultValue(descriptor, name_resolver);
  (*variables)["capitalized_type"] = "String";
  (*variables)["tag"] =
      SimpleItoa(static_cast<int32>(WireFormat::MakeTag(descriptor)));
  (*variables)["tag_size"] = SimpleItoa(
      WireFormat::TagSize(descriptor->number(), GetType(descriptor)));
  (*variables)["null_check"] =
      "  if (value == null) {\n"
      "    throw new NullPointerException();\n"
      "  }\n";
  (*variables)["writeString"] =
      "com.google.protobuf.GeneratedMessage" + GeneratedCodeVersionSuffix() +
      ".writeString";
  (*variables)["computeStringSize"] =
      "com.google.protobuf.GeneratedMessage" + GeneratedCodeVersionSuffix() +
      ".computeStringSize";

  // TODO(birdo): Add @deprecated javadoc when generating javadoc is supported
  // by the proto compiler
  (*variables)["deprecation"] = descriptor->options().deprecated()
      ? "@java.lang.Deprecated " : "";
  (*variables)["on_changed"] = "onChanged();";

  if (SupportFieldPresence(descriptor->file())) {
    // For singular messages and builders, one bit is used for the hasField bit.
    (*variables)["get_has_field_bit_message"] = GenerateGetBit(messageBitIndex);
    (*variables)["get_has_field_bit_builder"] = GenerateGetBit(builderBitIndex);

    // Note that these have a trailing ";".
    (*variables)["set_has_field_bit_message"] =
        GenerateSetBit(messageBitIndex) + ";";
    (*variables)["set_has_field_bit_builder"] =
        GenerateSetBit(builderBitIndex) + ";";
    (*variables)["clear_has_field_bit_builder"] =
        GenerateClearBit(builderBitIndex) + ";";

    (*variables)["is_field_present_message"] = GenerateGetBit(messageBitIndex);
  } else {
    (*variables)["set_has_field_bit_message"] = "";
    (*variables)["set_has_field_bit_builder"] = "";
    (*variables)["clear_has_field_bit_builder"] = "";

    (*variables)["is_field_present_message"] =
        "!get" + (*variables)["capitalized_name"] + "Bytes().isEmpty()";
  }

  // For repeated builders, one bit is used for whether the array is immutable.
  (*variables)["get_mutable_bit_builder"] = GenerateGetBit(builderBitIndex);
  (*variables)["set_mutable_bit_builder"] = GenerateSetBit(builderBitIndex);
  (*variables)["clear_mutable_bit_builder"] = GenerateClearBit(builderBitIndex);

  // For repeated fields, one bit is used for whether the array is immutable
  // in the parsing constructor.
  (*variables)["get_mutable_bit_parser"] =
      GenerateGetBitMutableLocal(builderBitIndex);
  (*variables)["set_mutable_bit_parser"] =
      GenerateSetBitMutableLocal(builderBitIndex);

  (*variables)["get_has_field_bit_from_local"] =
      GenerateGetBitFromLocal(builderBitIndex);
  (*variables)["set_has_field_bit_to_local"] =
      GenerateSetBitToLocal(messageBitIndex);
}